

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gemX_points.cpp
# Opt level: O3

void __thiscall
Am_Drawonable_Impl::Get_Polygon_Bounding_Box
          (Am_Drawonable_Impl *this,Am_Point_List *pl,Am_Style *ls,int *out_left,int *out_top,
          int *width,int *height)

{
  ulong uVar1;
  bool bVar2;
  unsigned_short uVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  double dVar11;
  double dVar12;
  int y;
  int x;
  short thick;
  double by;
  double bx;
  int firsty;
  int firstx;
  int nexty;
  int nextx;
  int th1;
  int th0;
  Am_Join_Style_Flag join;
  Am_Line_Cap_Style_Flag cap;
  int lastx;
  Am_Image_Array stipple;
  Am_Fill_Poly_Flag poly;
  Am_Fill_Solid_Flag fill;
  int dashl;
  Am_Line_Solid_Flag solid;
  char *dash;
  int local_108;
  int local_104;
  ushort local_fe;
  int local_fc;
  Am_Point_List local_f8;
  undefined8 local_e8;
  undefined8 local_e0;
  int local_d4;
  int local_d0;
  int local_cc;
  int local_c8;
  int local_c4;
  int local_c0;
  int local_bc;
  Am_Join_Style_Flag local_b8;
  Am_Line_Cap_Style_Flag local_b4;
  int local_b0;
  int local_ac;
  int *local_a8;
  int *local_a0;
  int *local_98;
  Am_Image_Array local_90;
  double local_88;
  ulong uStack_80;
  double local_78;
  ulong uStack_70;
  double local_68;
  double local_60;
  Am_Fill_Poly_Flag local_58;
  Am_Fill_Solid_Flag local_54;
  int local_50;
  Am_Line_Solid_Flag local_4c;
  double local_48;
  undefined8 uStack_40;
  char *local_38;
  
  local_a8 = out_left;
  local_a0 = out_top;
  local_98 = width;
  Am_Image_Array::Am_Image_Array(&local_90);
  Am_Style::Get_Values
            (ls,(short *)&local_fe,&local_b4,&local_b8,&local_4c,&local_38,&local_50,&local_54,
             &local_58,&local_90);
  uVar4 = (uint)local_fe;
  if ((0 < (short)local_fe) && (local_b8 == Am_JOIN_MITER)) {
    uVar3 = Am_Point_List::Length(pl);
    if (2 < uVar3) {
      Am_Point_List::Am_Point_List(&local_f8,pl);
      iVar5 = (int)(short)local_fe;
      Am_Point_List::Start(&local_f8);
      Am_Point_List::Get(&local_f8,&local_d0,&local_d4);
      Am_Point_List::End(&local_f8);
      Am_Point_List::Get(&local_f8,&local_ac,&local_b0);
      if (local_b0 == local_d4 && local_ac == local_d0) {
        local_fc = local_d4;
        Am_Point_List::Prev(&local_f8);
        Am_Point_List::Get(&local_f8,&local_104,&local_108);
        Am_Point_List::Start(&local_f8);
        next_vertex(&local_f8,local_104,local_108,&local_104,&local_108,(double *)&local_e0,
                    (double *)&local_e8);
        iVar7 = local_ac;
        iVar10 = local_fc;
        iVar9 = local_ac;
      }
      else {
        iVar6 = (int)(short)(local_fe - ((short)local_fe >> 0xf)) >> 1;
        if (local_b4 == Am_CAP_PROJECTING) {
          iVar6 = iVar5;
        }
        iVar9 = local_ac - iVar6;
        if (local_d0 - iVar6 < local_ac - iVar6) {
          iVar9 = local_d0 - iVar6;
        }
        iVar7 = local_ac + iVar6;
        if (local_ac + iVar6 < local_d0 + iVar6) {
          iVar7 = local_d0 + iVar6;
        }
        iVar10 = local_b0 - iVar6;
        if (local_d4 - iVar6 < local_b0 - iVar6) {
          iVar10 = local_d4 - iVar6;
        }
        local_fc = iVar6 + local_b0;
        if (iVar6 + local_b0 < local_d4 + iVar6) {
          local_fc = local_d4 + iVar6;
        }
        Am_Point_List::Start(&local_f8);
        Am_Point_List::Next(&local_f8);
        next_vertex(&local_f8,local_d0,local_d4,&local_104,&local_108,(double *)&local_e0,
                    (double *)&local_e8);
      }
      local_88 = (double)CONCAT44(local_e0._4_4_,(int)local_e0);
      uStack_80 = 0;
      local_78 = (double)CONCAT44(local_e8._4_4_,(int)local_e8);
      uStack_70 = 0;
      bVar2 = next_vertex(&local_f8,local_104,local_108,&local_c8,&local_cc,(double *)&local_e0,
                          (double *)&local_e8);
      if (bVar2) {
        local_68 = (double)iVar5 * 0.5;
        local_c0 = (int)(short)(local_fe - ((short)local_fe >> 0xf)) >> 1;
        local_c4 = (int)(short)((iVar5 - (iVar5 + 1 >> 0x1f)) + 1U >> 1);
        dVar11 = local_78;
        uVar1 = uStack_70;
        do {
          dVar12 = -local_88;
          dVar11 = -dVar11;
          local_48 = (double)CONCAT44(local_e0._4_4_,(int)local_e0);
          local_88 = (double)CONCAT44(local_e8._4_4_,(int)local_e8);
          uStack_40 = 0;
          uStack_80 = 0;
          local_bc = iVar7;
          if (ABS(dVar12 * local_48 + dVar11 * local_88) <= 0.981627183) {
            local_60 = local_68 / (dVar12 * local_88 - local_48 * dVar11);
            local_78 = dVar11;
            uStack_70 = uVar1 ^ 0x8000000000000000;
            dVar11 = ceil(ABS((dVar12 + local_48) * local_60));
            dVar12 = ceil(ABS((local_78 + local_88) * local_60));
            iVar5 = local_104 - (int)dVar11;
            iVar6 = local_104 + (int)dVar11;
            iVar7 = local_108 - (int)dVar12;
            iVar8 = local_108 + (int)dVar12;
          }
          else {
            iVar5 = local_104 - local_c0;
            iVar6 = local_104 + local_c4;
            iVar7 = local_108 - local_c0;
            iVar8 = local_108 + local_c4;
          }
          local_104 = local_c8;
          local_108 = local_cc;
          bVar2 = next_vertex(&local_f8,local_c8,local_cc,&local_c8,&local_cc,(double *)&local_e0,
                              (double *)&local_e8);
          if (local_fc <= iVar8) {
            local_fc = iVar8;
          }
          if (iVar7 <= iVar10) {
            iVar10 = iVar7;
          }
          iVar7 = local_bc;
          if (local_bc <= iVar6) {
            iVar7 = iVar6;
          }
          if (iVar5 <= iVar9) {
            iVar9 = iVar5;
          }
          dVar11 = local_88;
          uVar1 = uStack_80;
          local_88 = local_48;
        } while (bVar2);
      }
      Am_Point_List::~Am_Point_List(&local_f8);
      *local_a8 = iVar9;
      *local_a0 = iVar10;
      *local_98 = (iVar7 - iVar9) + 1;
      *height = (local_fc - iVar10) + 1;
      goto LAB_0027ccb6;
    }
    uVar4 = (uint)local_fe;
  }
  Am_Point_List::Get_Extents(pl,&local_104,&local_108,(int *)&local_e0,(int *)&local_e8);
  uVar4 = (uint)(short)((short)(uVar4 >> 0xf) + (short)uVar4);
  iVar5 = (int)uVar4 >> 1;
  uVar4 = uVar4 | 1;
  *local_a8 = local_104 - iVar5;
  *local_a0 = local_108 - iVar5;
  *local_98 = (uVar4 - local_104) + (int)local_e0;
  *height = (uVar4 - local_108) + (int)local_e8;
LAB_0027ccb6:
  Am_Image_Array::~Am_Image_Array(&local_90);
  return;
}

Assistant:

void
Am_Drawonable_Impl::Get_Polygon_Bounding_Box(const Am_Point_List &pl,
                                             const Am_Style &ls, int &out_left,
                                             int &out_top, int &width,
                                             int &height)
{
  short thick;
  Am_Line_Cap_Style_Flag cap;
  Am_Join_Style_Flag join;
  Am_Line_Solid_Flag solid;
  const char *dash;
  int dashl;
  Am_Fill_Solid_Flag fill;
  Am_Fill_Poly_Flag poly;
  Am_Image_Array stipple;

  ls.Get_Values(thick, cap, join, solid, dash, dashl, fill, poly, stipple);

  if (thick > 0 && join == Am_JOIN_MITER && pl.Length() > 2) {
    int right, bottom, left, top;
    // slow: does several flops per point to compute the true vertex of
    // the mitered join
    compute_mitered_join_extents(pl, thick, cap, left, top, right, bottom);
    out_left = left;
    out_top = top;
    width = right - left + 1;
    height = bottom - top + 1;
  } else {
    const int th = thick / 2;

    // fast: just four comparisons per point, then adjust thickness
    int right, bottom, left, top;
    pl.Get_Extents(left, top, right, bottom);

    out_left = left - th;
    out_top = top - th;
    width = right - left + 1 + 2 * th;
    height = bottom - top + 1 + 2 * th;
  }
}